

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O2

void __thiscall amount_tests::MoneyRangeTest::test_method(MoneyRangeTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  value_type *pvVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 local_8a;
  value_type local_89;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x10;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_80 = "";
  pvVar2 = &local_89;
  local_89 = '\0';
  local_8a = 0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_88,0x10,1,2,pvVar2,"MoneyRange(CAmount(-1))",&local_8a,"false");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x11;
  file_00.m_begin = (iterator)&local_a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b0,msg_00
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_b8 = "";
  local_89 = '\x01';
  local_8a = 1;
  pvVar2 = &local_89;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_c0,0x11,1,2,pvVar2,"MoneyRange(CAmount(0))",&local_8a,"true");
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x12;
  file_01.m_begin = (iterator)&local_d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e0,msg_01
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_e8 = "";
  local_89 = '\x01';
  local_8a = 1;
  pvVar2 = &local_89;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_f0,0x12,1,2,pvVar2,"MoneyRange(CAmount(1))",&local_8a,"true");
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x13;
  file_02.m_begin = (iterator)&local_100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_110,
             msg_02);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_118 = "";
  local_89 = '\x01';
  local_8a = 1;
  pvVar2 = &local_89;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_120,0x13,1,2,pvVar2,"MoneyRange(MAX_MONEY)",&local_8a,"true");
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x14;
  file_03.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_140,
             msg_03);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_148 = "";
  local_89 = '\0';
  local_8a = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_150,0x14,1,2,&local_89,"MoneyRange(MAX_MONEY + CAmount(1))",&local_8a,
             "false");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MoneyRangeTest)
{
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(-1)), false);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(0)), true);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(1)), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY + CAmount(1)), false);
}